

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

void proto2_unittest::TestMessageWithCustomOptions::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  TestMessageWithCustomOptions *this;
  MessageLite *value;
  TestMessageWithCustomOptions **v1;
  TestMessageWithCustomOptions **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  Arena *arena;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  TestMessageWithCustomOptions *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestMessageWithCustomOptions *from;
  TestMessageWithCustomOptions *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  TestMessageWithCustomOptions *local_18;
  anon_union_72_1_493b367e_for_TestMessageWithCustomOptions_9 *local_10;
  
  local_50 = (TestMessageWithCustomOptions *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestMessageWithCustomOptions *)to_msg;
  _this = (TestMessageWithCustomOptions *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestMessageWithCustomOptions_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestMessageWithCustomOptions*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestMessageWithCustomOptions_const*,proto2_unittest::TestMessageWithCustomOptions*>
                       (v1,v2,"&from != _this");
  if (local_48 == (Nullable<const_char_*>)0x0) {
    google::protobuf::internal::
    TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MergeFrom(&(from->field_0)._impl_.map_field_.
                 super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,(TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(absl_log_internal_check_op_result + 0x18));
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    this = from;
    uVar1 = *puVar5;
    if ((uVar1 & 1) != 0) {
      to_msg_local = (MessageLite *)
                     _internal_field1_abi_cxx11_
                               ((TestMessageWithCustomOptions *)absl_log_internal_check_op_result);
      local_18 = this;
      local_10 = &this->field_0;
      puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(this->field_0)._impl_._has_bits_,0);
      value = to_msg_local;
      *puVar5 = *puVar5 | 1;
      arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(this->field_0)._impl_.field1_,(string *)value,arena);
    }
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar5 = uVar1 | *puVar5;
    uVar2 = *(uint32_t *)(absl_log_internal_check_op_result + 0x54);
    if (uVar2 != 0) {
      uVar3 = (from->field_0)._impl_._oneof_case_[0];
      if (uVar3 != uVar2) {
        if (uVar3 != 0) {
          clear_AnOneof(from);
        }
        (from->field_0)._impl_._oneof_case_[0] = uVar2;
      }
      if ((uVar2 != 0) && (uVar2 == 2)) {
        (from->field_0)._impl_.AnOneof_ =
             *(AnOneofUnion *)(absl_log_internal_check_op_result + 0x50);
      }
    }
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_custom_options.pb.cc"
             ,0x65f,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

void TestMessageWithCustomOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMessageWithCustomOptions*>(&to_msg);
  auto& from = static_cast<const TestMessageWithCustomOptions&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestMessageWithCustomOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_field_.MergeFrom(from._impl_.map_field_);
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_internal_set_field1(from._internal_field1());
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_AnOneof();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofField: {
        _this->_impl_.AnOneof_.oneof_field_ = from._impl_.AnOneof_.oneof_field_;
        break;
      }
      case ANONEOF_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}